

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * google::protobuf::compiler::ruby::StringifySyntax_abi_cxx11_(Syntax syntax)

{
  int in_ESI;
  string *in_RDI;
  LogMessage *in_stack_ffffffffffffff68;
  allocator *paVar1;
  LogMessage *this;
  undefined8 in_stack_ffffffffffffff78;
  LogMessage *in_stack_ffffffffffffff80;
  allocator local_5a [2];
  LogMessage local_58;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI != 0) {
    if (in_ESI == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"proto2",local_d);
      std::allocator<char>::~allocator((allocator<char> *)local_d);
      return in_RDI;
    }
    if (in_ESI == 3) {
      paVar1 = local_1d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"proto3",paVar1);
      std::allocator<char>::~allocator((allocator<char> *)local_1d);
      return in_RDI;
    }
  }
  this = &local_58;
  internal::LogMessage::LogMessage
            (in_stack_ffffffffffffff80,(LogLevel)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (char *)this,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  internal::LogMessage::operator<<(this,(char *)in_stack_ffffffffffffff68);
  internal::LogFinisher::operator=((LogFinisher *)this,in_stack_ffffffffffffff68);
  internal::LogMessage::~LogMessage((LogMessage *)0x4c9f7b);
  paVar1 = local_5a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",paVar1);
  std::allocator<char>::~allocator((allocator<char> *)local_5a);
  return in_RDI;
}

Assistant:

string StringifySyntax(FileDescriptor::Syntax syntax) {
  switch (syntax) {
    case FileDescriptor::SYNTAX_PROTO2:
      return "proto2";
    case FileDescriptor::SYNTAX_PROTO3:
      return "proto3";
    case FileDescriptor::SYNTAX_UNKNOWN:
    default:
      GOOGLE_LOG(FATAL) << "Unsupported syntax; this generator only supports "
                           "proto2 and proto3 syntax.";
      return "";
  }
}